

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_block_manager.cpp
# Opt level: O1

bool __thiscall
duckdb::PartialBlockManager::GetPartialBlock
          (PartialBlockManager *this,idx_t segment_size,
          unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>
          *partial_block)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Head_base<0UL,_duckdb::PartialBlock_*,_false> _Var3;
  _Head_base<0UL,_duckdb::PartialBlock_*,_false> _Var4;
  const_iterator __position;
  
  p_Var1 = &(this->partially_filled_blocks)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this->partially_filled_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  __position._M_node = &p_Var1->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0;
      p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) < segment_size]) {
    if (*(ulong *)(p_Var2 + 1) >= segment_size) {
      __position._M_node = p_Var2;
    }
  }
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    _Var3._M_head_impl = (PartialBlock *)__position._M_node[1]._M_parent;
    __position._M_node[1]._M_parent = (_Base_ptr)0x0;
    _Var4._M_head_impl =
         (partial_block->
         super_unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>)._M_t.
         super___uniq_ptr_impl<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>.
         super__Head_base<0UL,_duckdb::PartialBlock_*,_false>._M_head_impl;
    (partial_block->
    super_unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>)._M_t.
    super___uniq_ptr_impl<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>.
    super__Head_base<0UL,_duckdb::PartialBlock_*,_false>._M_head_impl = _Var3._M_head_impl;
    if (_Var4._M_head_impl != (PartialBlock *)0x0) {
      (**(code **)((long)(_Var4._M_head_impl)->_vptr_PartialBlock + 8))();
    }
    ::std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>_>_>_>
    ::_M_erase_aux(&(this->partially_filled_blocks)._M_t,__position);
  }
  return (_Rb_tree_header *)__position._M_node != p_Var1;
}

Assistant:

bool PartialBlockManager::GetPartialBlock(idx_t segment_size, unique_ptr<PartialBlock> &partial_block) {
	auto entry = partially_filled_blocks.lower_bound(segment_size);
	if (entry == partially_filled_blocks.end()) {
		return false;
	}
	// found a partially filled block! fill in the info
	partial_block = std::move(entry->second);
	partially_filled_blocks.erase(entry);

	D_ASSERT(partial_block->state.offset > 0);
	D_ASSERT(ValueIsAligned(partial_block->state.offset));
	return true;
}